

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * isCandidateForInOpt(Expr *pX)

{
  SrcList *pSVar1;
  Expr *pRes;
  int i;
  Table *pTab;
  ExprList *pEList;
  SrcList *pSrc;
  Select *p;
  Expr *pX_local;
  
  if ((pX->flags & 0x800) == 0) {
    pX_local = (Expr *)0x0;
  }
  else if ((pX->flags & 0x20) == 0) {
    pX_local = (Expr *)(pX->x).pSelect;
    if (((Select *)pX_local)->pPrior == (Select *)0x0) {
      if ((((Select *)pX_local)->selFlags & 9) == 0) {
        if (((Select *)pX_local)->pLimit == (Expr *)0x0) {
          if (((Select *)pX_local)->pWhere == (Expr *)0x0) {
            pSVar1 = ((Select *)pX_local)->pSrc;
            if (pSVar1->nSrc == 1) {
              if (pSVar1->a[0].pSelect == (Select *)0x0) {
                if ((pSVar1->a[0].pTab)->nModuleArg == 0) {
                  for (pRes._4_4_ = 0; pRes._4_4_ < ((Select *)pX_local)->pEList->nExpr;
                      pRes._4_4_ = pRes._4_4_ + 1) {
                    if ((((Select *)pX_local)->pEList->a[pRes._4_4_].pExpr)->op != 0xa2) {
                      return (Select *)0x0;
                    }
                  }
                }
                else {
                  pX_local = (Expr *)0x0;
                }
              }
              else {
                pX_local = (Expr *)0x0;
              }
            }
            else {
              pX_local = (Expr *)0x0;
            }
          }
          else {
            pX_local = (Expr *)0x0;
          }
        }
        else {
          pX_local = (Expr *)0x0;
        }
      }
      else {
        pX_local = (Expr *)0x0;
      }
    }
    else {
      pX_local = (Expr *)0x0;
    }
  }
  else {
    pX_local = (Expr *)0x0;
  }
  return (Select *)pX_local;
}

Assistant:

static Select *isCandidateForInOpt(Expr *pX){
  Select *p;
  SrcList *pSrc;
  ExprList *pEList;
  Table *pTab;
  int i;
  if( !ExprHasProperty(pX, EP_xIsSelect) ) return 0;  /* Not a subquery */
  if( ExprHasProperty(pX, EP_VarSelect)  ) return 0;  /* Correlated subq */
  p = pX->x.pSelect;
  if( p->pPrior ) return 0;              /* Not a compound SELECT */
  if( p->selFlags & (SF_Distinct|SF_Aggregate) ){
    testcase( (p->selFlags & (SF_Distinct|SF_Aggregate))==SF_Distinct );
    testcase( (p->selFlags & (SF_Distinct|SF_Aggregate))==SF_Aggregate );
    return 0; /* No DISTINCT keyword and no aggregate functions */
  }
  assert( p->pGroupBy==0 );              /* Has no GROUP BY clause */
  if( p->pLimit ) return 0;              /* Has no LIMIT clause */
  if( p->pWhere ) return 0;              /* Has no WHERE clause */
  pSrc = p->pSrc;
  assert( pSrc!=0 );
  if( pSrc->nSrc!=1 ) return 0;          /* Single term in FROM clause */
  if( pSrc->a[0].pSelect ) return 0;     /* FROM is not a subquery or view */
  pTab = pSrc->a[0].pTab;
  assert( pTab!=0 );
  assert( pTab->pSelect==0 );            /* FROM clause is not a view */
  if( IsVirtual(pTab) ) return 0;        /* FROM clause not a virtual table */
  pEList = p->pEList;
  assert( pEList!=0 );
  /* All SELECT results must be columns. */
  for(i=0; i<pEList->nExpr; i++){
    Expr *pRes = pEList->a[i].pExpr;
    if( pRes->op!=TK_COLUMN ) return 0;
    assert( pRes->iTable==pSrc->a[0].iCursor );  /* Not a correlated subquery */
  }
  return p;
}